

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

int stbir__edge_wrap_slow(stbir_edge edge,int n,int max)

{
  int local_20;
  int m;
  int max2;
  int max_local;
  int n_local;
  stbir_edge edge_local;
  
  n_local = n;
  switch(edge) {
  case STBIR_EDGE_CLAMP:
    if (n < 0) {
      n_local = 0;
    }
    else if (max <= n) {
      n_local = max + -1;
    }
    break;
  case STBIR_EDGE_REFLECT:
    if (n < 0) {
      if (n < max) {
        n_local = -n;
      }
      else {
        n_local = max + -1;
      }
    }
    else if (max <= n) {
      if (n < max * 2) {
        n_local = (max * 2 - n) + -1;
      }
      else {
        n_local = 0;
      }
    }
    break;
  case STBIR_EDGE_WRAP:
    if (n < 0) {
      local_20 = -n % max;
      if (local_20 != 0) {
        local_20 = max - local_20;
      }
      n_local = local_20;
    }
    else {
      n_local = n % max;
    }
    break;
  case STBIR_EDGE_ZERO:
    n_local = 0;
    break;
  default:
    __assert_fail("!\"Unimplemented edge type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                  ,0x3e3,"int stbir__edge_wrap_slow(stbir_edge, int, int)");
  }
  return n_local;
}

Assistant:

static int stbir__edge_wrap_slow(stbir_edge edge, int n, int max)
{
    switch (edge)
    {
    case STBIR_EDGE_ZERO:
        return 0; // we'll decode the wrong pixel here, and then overwrite with 0s later

    case STBIR_EDGE_CLAMP:
        if (n < 0)
            return 0;

        if (n >= max)
            return max - 1;

        return n; // NOTREACHED

    case STBIR_EDGE_REFLECT:
    {
        if (n < 0)
        {
            if (n < max)
                return -n;
            else
                return max - 1;
        }

        if (n >= max)
        {
            int max2 = max * 2;
            if (n >= max2)
                return 0;
            else
                return max2 - n - 1;
        }

        return n; // NOTREACHED
    }

    case STBIR_EDGE_WRAP:
        if (n >= 0)
            return (n % max);
        else
        {
            int m = (-n) % max;

            if (m != 0)
                m = max - m;

            return (m);
        }
        // NOTREACHED

    default:
        STBIR_ASSERT(!"Unimplemented edge type");
        return 0;
    }
}